

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall
SQCompilation::CodegenVisitor::visitLiteralExpr(CodegenVisitor *this,LiteralExpr *lit)

{
  SQFuncState *this_00;
  SQInteger arg1;
  SQInteger SVar1;
  ulong arg1_00;
  SQOpcode _op;
  SQFuncState *pSVar2;
  SQObject local_38;
  
  maybeAddInExprLine(this,(Expr *)lit);
  switch(lit->_kind) {
  case LK_STRING:
    pSVar2 = this->_fs;
    SVar1 = SQFuncState::PushTarget(pSVar2,-1);
    this_00 = this->_fs;
    local_38 = SQFuncState::CreateString(this_00,(lit->_v).s,-1);
    arg1 = SQFuncState::GetConstant(this_00,&local_38,0x7fffffff);
    SQFuncState::AddInstruction(pSVar2,_OP_LOAD,SVar1,arg1,0,0);
    return;
  case LK_INT:
    EmitLoadConstInt(this,(lit->_v).i,-1);
    return;
  case LK_FLOAT:
    EmitLoadConstFloat(this,(lit->_v).f,-1);
    return;
  case LK_BOOL:
    pSVar2 = this->_fs;
    SVar1 = SQFuncState::PushTarget(pSVar2,-1);
    arg1_00 = (ulong)(lit->_v).b;
    _op = _OP_LOADBOOL;
    break;
  case LK_NULL:
    pSVar2 = this->_fs;
    SVar1 = SQFuncState::PushTarget(pSVar2,-1);
    _op = _OP_LOADNULLS;
    arg1_00 = 1;
    break;
  default:
    return;
  }
  SQFuncState::AddInstruction(pSVar2,_op,SVar1,arg1_00,0,0);
  return;
}

Assistant:

void CodegenVisitor::visitLiteralExpr(LiteralExpr *lit) {
    maybeAddInExprLine(lit);
    switch (lit->kind()) {
    case LK_STRING:
        _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(_fs->CreateString(lit->s())));
        break;
    case LK_FLOAT:EmitLoadConstFloat(lit->f(), -1); break;
    case LK_INT:  EmitLoadConstInt(lit->i(), -1); break;
    case LK_BOOL: _fs->AddInstruction(_OP_LOADBOOL, _fs->PushTarget(), lit->b()); break;
    case LK_NULL: _fs->AddInstruction(_OP_LOADNULLS, _fs->PushTarget(), 1); break;
    }
}